

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_0.cpp
# Opt level: O2

void __thiscall
ParserTransform_hodgkinHuxleyCellml10_Test::TestBody
          (ParserTransform_hodgkinHuxleyCellml10_Test *this)

{
  char *pcVar1;
  unsigned_long local_78;
  AssertionResult gtest_ar_3;
  ValidatorPtr validator;
  unsigned_long local_30;
  ModelPtr model;
  ParserPtr parser;
  
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_3,"cellml1X/Hodgkin_Huxley_1952_modified.cellml",
             (allocator<char> *)&local_78);
  fileContents((string *)&validator);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::~string((string *)&gtest_ar_3);
  gtest_ar_3.success_ = true;
  gtest_ar_3._1_7_ = 0;
  local_78 = libcellml::Model::unitsCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&validator,"size_t(7)","model->unitsCount()",(unsigned_long *)&gtest_ar_3,
             &local_78);
  if ((char)validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)validator.
                         super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/cellml_1_0.cpp"
               ,0x65,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  gtest_ar_3.success_ = true;
  gtest_ar_3._1_7_ = 0;
  local_78 = libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&validator,"size_t(5)","model->componentCount()",
             (unsigned_long *)&gtest_ar_3,&local_78);
  if ((char)validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)validator.
                         super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/cellml_1_0.cpp"
               ,0x66,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  gtest_ar_3.success_ = true;
  gtest_ar_3._1_7_ = 0;
  local_78 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&validator,"size_t(4)","parser->issueCount()",(unsigned_long *)&gtest_ar_3,
             &local_78);
  if ((char)validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)validator.
                         super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/cellml_1_0.cpp"
               ,0x67,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  libcellml::Validator::create();
  libcellml::Validator::validateModel
            ((shared_ptr *)
             CONCAT71(validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr._1_7_,
                      (char)validator.
                            super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr));
  local_78 = 0;
  local_30 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_3,"size_t(0)","validator->issueCount()",&local_78,&local_30);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if (gtest_ar_3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/parser/cellml_1_0.cpp"
               ,0x6c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_30,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_3.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(ParserTransform, hodgkinHuxleyCellml10)
{
    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    auto model = parser->parseModel(fileContents("cellml1X/Hodgkin_Huxley_1952_modified.cellml"));

    EXPECT_EQ(size_t(7), model->unitsCount());
    EXPECT_EQ(size_t(5), model->componentCount());
    EXPECT_EQ(size_t(4), parser->issueCount());

    auto validator = libcellml::Validator::create();
    validator->validateModel(model);

    EXPECT_EQ(size_t(0), validator->issueCount());
}